

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O2

vector<Bipartition,_std::allocator<Bipartition>_> * __thiscall
PhyloTree::getSplits
          (vector<Bipartition,_std::allocator<Bipartition>_> *__return_storage_ptr__,PhyloTree *this
          )

{
  pointer pPVar1;
  pointer this_00;
  Bipartition BStack_48;
  
  (__return_storage_ptr__->super__Vector_base<Bipartition,_std::allocator<Bipartition>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Bipartition,_std::allocator<Bipartition>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Bipartition,_std::allocator<Bipartition>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Bipartition,_std::allocator<Bipartition>_>::reserve
            (__return_storage_ptr__,
             ((long)(this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x48);
  pPVar1 = (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                 _M_impl.super__Vector_impl_data._M_start; this_00 != pPVar1; this_00 = this_00 + 1)
  {
    PhyloTreeEdge::asSplit(&BStack_48,this_00);
    std::vector<Bipartition,_std::allocator<Bipartition>_>::emplace_back<Bipartition>
              (__return_storage_ptr__,&BStack_48);
    Bipartition::~Bipartition(&BStack_48);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Bipartition> PhyloTree::getSplits() {
    vector<Bipartition> splits;
    splits.reserve(edges.size());
    for (auto &edge : edges) {
        splits.push_back(edge.asSplit());
    }

    return splits;
}